

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall imrt::Collimator::printActiveBeam(Collimator *this)

{
  _Rb_tree_color _Var1;
  long *plVar2;
  ostream *this_00;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> angle;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  for (p_Var3 = (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header
      ; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    _Var1 = p_Var3[1]._M_color;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_48,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &p_Var3[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Angle: ",7);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar4 = 0;
      do {
        this_00 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,
                             local_48.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].first);
        std::__ostream_insert<char,std::char_traits<char>>(this_00," , ",3);
        plVar2 = (long *)std::ostream::operator<<
                                   ((ostream *)this_00,
                                    local_48.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar4].second);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)local_48.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_48.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Collimator::printActiveBeam() {
    for(auto angle:angle_row_beam_active){
      cout << "Angle: " << angle.first << endl;
      for (int i =0; i < angle.second.size(); i++) {
         cout << angle.second[i].first << " , " << angle.second[i].second<< endl;
      }
    }
  }